

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bfextu_32_pcdi(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint local_1c;
  uint local_18;
  uint ea;
  uint data;
  uint width;
  sint offset;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar1 = m68ki_read_imm_16();
    data = uVar1 >> 6 & 0x1f;
    local_1c = m68ki_get_ea_pcdi();
    if ((uVar1 & 0x800) != 0) {
      data = m68ki_cpu.dar[(int)(uVar1 >> 6 & 7)];
    }
    ea = uVar1;
    if ((uVar1 & 0x20) != 0) {
      ea = m68ki_cpu.dar[uVar1 & 7];
    }
    local_1c = (int)data / 8 + local_1c;
    data = (int)data % 8;
    if ((int)data < 0) {
      data = data + 8;
      local_1c = local_1c - 1;
    }
    iVar2 = (ea - 1 & 0x1f) + 1;
    uVar3 = m68ki_read_32_fc(local_1c,m68ki_cpu.s_flag | m68ki_address_space);
    local_18 = uVar3 << ((byte)data & 0x1f);
    if (0x20 < data + iVar2) {
      uVar3 = m68ki_read_8_fc(local_1c + 4,m68ki_cpu.s_flag | m68ki_address_space);
      local_18 = (uVar3 << ((byte)data & 0x1f)) >> 8 | local_18;
    }
    m68ki_cpu.n_flag = local_18 >> 0x18;
    m68ki_cpu.not_z_flag = local_18 >> (0x20U - (char)iVar2 & 0x1f);
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    m68ki_cpu.dar[uVar1 >> 0xc & 7] = m68ki_cpu.not_z_flag;
  }
  return;
}

Assistant:

static void m68k_op_bfextu_32_pcdi(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint data;
		uint ea = EA_PCDI_8();


		if(BIT_B(word2))
		offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		data = m68ki_read_32(ea);
		data = MASK_OUT_ABOVE_32(data<<offset);

		if((offset+width) > 32)
			data |= (m68ki_read_8(ea+4) << offset) >> 8;

		FLAG_N = NFLAG_32(data);
		data  >>= (32 - width);

		FLAG_Z = data;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		REG_D[(word2 >> 12) & 7] = data;

		return;
	}
	m68ki_exception_illegal();
}